

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

ulong rand_range(ulong rand_val,ulong range)

{
  ulong lo;
  ulong hi;
  ulong range_local;
  ulong rand_val_local;
  
  return (rand_val >> 0x10 & 0xffff) * (range >> 0x10 & 0xffff) +
         ((rand_val >> 0x10 & 0xffff) * (range & 0xffff) >> 0x10) +
         ((rand_val & 0xffff) * (range >> 0x10 & 0xffff) >> 0x10) +
         (((rand_val >> 0x10 & 0xffff) * (range & 0xffff) & 0xffff) +
          ((rand_val & 0xffff) * (range >> 0x10 & 0xffff) & 0xffff) +
          ((rand_val & 0xffff) * (range & 0xffff) >> 0x10) >> 0x10);
}

Assistant:

static inline ulong rand_range(ulong rand_val, ulong range)
{
    /* calculate the high-order 32 bits of (rand_val / 2^32 * range) */
    ulong hi = (((rand_val >> 16) & 0xffff) * ((range >> 16) & 0xffff))
               + ((((rand_val >> 16) & 0xffff) * (range & 0xffff)) >> 16)
               + (((rand_val & 0xffff) * ((range >> 16) & 0xffff)) >> 16);
    
    /* calculate the low-order 32 bits */
    ulong lo = ((((rand_val >> 16) & 0xffff) * (range & 0xffff)) & 0xffff)
               + (((rand_val & 0xffff) * ((range >> 16) & 0xffff)) & 0xffff)
               + ((((rand_val & 0xffff) * (range & 0xffff)) >> 16) & 0xffff);

    /* add the carry from the low part into the high part to get the result */
    return hi + (lo >> 16);
}